

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldEncodingSynapse.cpp
# Opt level: O0

double __thiscall
ReceptiveFieldEncodingSynapse::gaussian(ReceptiveFieldEncodingSynapse *this,int index,double value)

{
  long in_RDI;
  double __x;
  double dVar1;
  __type _Var2;
  double dVar3;
  double gauss;
  double variance;
  double center;
  
  __x = 1.0 / ((1.0 / *(double *)(*(long *)(in_RDI + 0x18) + 0x10)) *
              ((*(double *)(*(long *)(in_RDI + 0x18) + 0x20) -
               *(double *)(*(long *)(in_RDI + 0x18) + 0x18)) /
              (double)(*(int *)(*(long *)(in_RDI + 0x18) + 8) + -1)));
  dVar1 = sqrt(6.283185307179586);
  _Var2 = std::pow<double,int>(__x,(int)((ulong)in_RDI >> 0x20));
  dVar3 = exp(_Var2 * -0.5);
  return __x * dVar1 * dVar3;
}

Assistant:

double ReceptiveFieldEncodingSynapse::gaussian(int index, double value) {
    double center = param->input_min + ((2*index+1-1)/2)*((param->input_max-param->input_min)/(param->number_of_neurons-1));
    double variance = 1/param->beta*((param->input_max-param->input_min)/(param->number_of_neurons-1));
    double gauss = 1 / variance * sqrt(2*M_PI) * exp(-0.5 * pow((value - center) / variance, 2));
    return gauss;
}